

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O0

Am_Value inter_value_from_panel_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar2;
  Am_Slot_Flags in_RSI;
  Am_Value AVar3;
  undefined1 local_48 [8];
  Am_Value panel_value;
  Am_Object local_28;
  Am_Object panel;
  Am_Object *self_local;
  Am_Value *value;
  
  panel.data._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  Am_Object::Get_Owner(&local_28,in_RSI);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_48);
    in_value = Am_Object::Peek(&local_28,0x169,0);
    Am_Value::operator=((Am_Value *)local_48,in_value);
    get_inter_value_from_panel_value((Am_Value *)local_48,&local_28,(Am_Value *)self);
    panel.data._7_1_ = 1;
    panel_value.value.float_value = 1.4013e-45;
    Am_Value::~Am_Value((Am_Value *)local_48);
  }
  else {
    panel.data._7_1_ = 1;
    panel_value.value.float_value = 1.4013e-45;
  }
  Am_Object::~Am_Object(&local_28);
  aVar2 = extraout_RDX;
  if ((panel.data._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar2 = extraout_RDX_00;
  }
  AVar3.value.wrapper_value = aVar2.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, inter_value_from_panel_value)
{
  Am_Value value;
  Am_Object panel = self.Get_Owner();
  if (!panel.Valid()) {
    return value;
  }
  Am_Value panel_value;
  panel_value = panel.Peek(Am_VALUE);
  // std::cout << "** computing inter " << self << " value from panel value " <<
  //  panel_value <<std::endl <<std::flush;
  get_inter_value_from_panel_value(panel_value, panel, value);
  return value;
}